

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O0

target_ulong addr_add(CPUPPCState_conflict2 *env,target_ulong addr,target_long arg)

{
  _Bool _Var1;
  target_long arg_local;
  target_ulong addr_local;
  CPUPPCState_conflict2 *env_local;
  
  _Var1 = msr_is_64bit(env,env->msr);
  if (_Var1) {
    env_local = (CPUPPCState_conflict2 *)(addr + arg);
  }
  else {
    env_local = (CPUPPCState_conflict2 *)(ulong)(uint)((int)addr + (int)arg);
  }
  return (target_ulong)env_local;
}

Assistant:

static target_long addr_add(DisasContext *ctx, target_long base,
                            target_long offset)
{
    target_long sum = base + offset;

#if defined(TARGET_MIPS64)
    if (ctx->hflags & MIPS_HFLAG_AWRAP) {
        sum = (int32_t)sum;
    }
#endif
    return sum;
}